

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_row_access.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
::erase_empty_row(Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
                  *this,uint rowIndex)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *pmVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  
  pmVar3 = this->rows_;
  p_Var7 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Rb_tree_node_base *)0x0) {
    p_Var1 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      bVar9 = p_Var7[1]._M_color < rowIndex;
      if (!bVar9) {
        p_Var8 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar9];
    } while (p_Var7 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var1) && (p_Var8[1]._M_color <= rowIndex)) &&
       (p_Var8[1]._M_parent == (_Base_ptr)0x0 ||
        p_Var8[1]._M_parent == (_Base_ptr)&p_Var8[1]._M_parent)) {
      pvVar6 = (void *)std::_Rb_tree_rebalance_for_erase
                                 (p_Var8,&(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header);
      puVar5 = *(undefined8 **)((long)pvVar6 + 0x28);
      while (puVar5 != (undefined8 *)((long)pvVar6 + 0x28)) {
        puVar4 = (undefined8 *)*puVar5;
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar5 = puVar4;
      }
      *(undefined8 *)((long)pvVar6 + 0x28) = 0;
      *(undefined8 *)((long)pvVar6 + 0x30) = 0;
      operator_delete(pvVar6,0x38);
      psVar2 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      *psVar2 = *psVar2 - 1;
      return;
    }
  }
  return;
}

Assistant:

void erase_empty_row(ID_index rowIndex) {
    static_assert(has_removable_rows, "'erase_empty_row' is not implemented for the chosen options.");

    auto it = rows_->find(rowIndex);
    if (it != rows_->end() && it->second.empty()) rows_->erase(it);
  }